

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ReverseSeqLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_reverseseq(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x3c5) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3c5;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.reverseseq_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ReverseSeqLayerParams>
                   (arena);
    (this->layer_).reverseseq_ = (ReverseSeqLayerParams *)LVar2;
  }
  return (ReverseSeqLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReverseSeqLayerParams* NeuralNetworkLayer::_internal_mutable_reverseseq() {
  if (!_internal_has_reverseseq()) {
    clear_layer();
    set_has_reverseseq();
    layer_.reverseseq_ = CreateMaybeMessage< ::CoreML::Specification::ReverseSeqLayerParams >(GetArenaForAllocation());
  }
  return layer_.reverseseq_;
}